

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void google::protobuf::internal::OnShutdownRun(_func_void_void_ptr *f,void *arg)

{
  ShutdownData *__x;
  pair<void_(*)(const_void_*),_const_void_*> pVar1;
  MutexLock lock;
  ShutdownData *shutdown_data;
  Mutex *in_stack_ffffffffffffffa8;
  MutexLock *in_stack_ffffffffffffffb0;
  
  __x = ShutdownData::get();
  MutexLock::MutexLock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pVar1 = std::make_pair<void(*&)(void_const*),void_const*&>
                    ((_func_void_void_ptr **)in_stack_ffffffffffffffb0,(void **)__x);
  std::
  vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
  ::push_back((vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
               *)pVar1.second,(value_type *)__x);
  MutexLock::~MutexLock((MutexLock *)0x5eec0d);
  return;
}

Assistant:

void OnShutdownRun(void (*f)(const void*), const void* arg) {
  auto shutdown_data = ShutdownData::get();
  MutexLock lock(&shutdown_data->mutex);
  shutdown_data->functions.push_back(std::make_pair(f, arg));
}